

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_hdr_set_samples(bcf_hdr_t *hdr,char *samples,int is_file)

{
  bcf_idinfo_t *pbVar1;
  bcf_idinfo_t *pbVar2;
  uint uVar3;
  int iVar4;
  khint_t kVar5;
  uint8_t *puVar6;
  char **ppcVar7;
  ulong uVar8;
  char *pcVar9;
  kh_vdict_t *pkVar10;
  uint uVar11;
  byte bVar12;
  long lVar13;
  byte bVar14;
  int local_3c;
  int n;
  int ignore;
  
  if (samples == (char *)0x0) {
    hdr->nsamples_ori = hdr->n[2];
    hdr->n[2] = 0;
  }
  else {
    uVar3 = (byte)*samples - 0x2d;
    if (uVar3 == 0) {
      uVar3 = (uint)(byte)samples[1];
    }
    if (uVar3 != 0) {
      iVar4 = hdr->n[2];
      hdr->nsamples_ori = iVar4;
      puVar6 = (uint8_t *)calloc((long)(iVar4 / 8 + 1),1);
      hdr->keep_samples = puVar6;
      uVar8 = 0;
      if (*samples == '^') {
        for (; (int)uVar8 < iVar4; uVar8 = (ulong)((int)uVar8 + 1)) {
          hdr->keep_samples[uVar8 >> 3] =
               hdr->keep_samples[uVar8 >> 3] | (byte)(1 << ((byte)uVar8 & 7));
          iVar4 = hdr->n[2];
        }
        uVar8 = (ulong)(*samples == '^');
      }
      ppcVar7 = hts_readlist(samples + uVar8,is_file,&n);
      if (ppcVar7 == (char **)0x0) {
        return -1;
      }
      local_3c = 0;
      for (lVar13 = 0; uVar8 = (ulong)n, lVar13 < (long)uVar8; lVar13 = lVar13 + 1) {
        uVar3 = bcf_hdr_id2int(hdr,2,ppcVar7[lVar13]);
        if ((int)uVar3 < 0) {
          if (local_3c == 0) {
            local_3c = (int)lVar13 + 1;
          }
        }
        else {
          if (hdr->n[2] <= (int)uVar3) {
            __assert_fail("idx<bcf_hdr_nsamples(hdr)",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                          ,0x9a6,"int bcf_hdr_set_samples(bcf_hdr_t *, const char *, int)");
          }
          bVar14 = hdr->keep_samples[uVar3 >> 3];
          bVar12 = (byte)(1 << ((byte)uVar3 & 7));
          if (*samples == '^') {
            bVar14 = bVar14 & ~bVar12;
          }
          else {
            bVar14 = bVar14 | bVar12;
          }
          hdr->keep_samples[uVar3 >> 3] = bVar14;
        }
      }
      for (lVar13 = 0; lVar13 < (int)uVar8; lVar13 = lVar13 + 1) {
        free(ppcVar7[lVar13]);
        uVar8 = (ulong)(uint)n;
      }
      free(ppcVar7);
      hdr->n[2] = 0;
      uVar3 = hdr->nsamples_ori;
      iVar4 = 0;
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
        if ((hdr->keep_samples[uVar11 >> 3] >> (uVar11 & 7) & 1) != 0) {
          iVar4 = iVar4 + 1;
          hdr->n[2] = iVar4;
        }
      }
      if (iVar4 != 0) {
        ppcVar7 = (char **)malloc((long)iVar4 << 3);
        iVar4 = 0;
        for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
          if ((hdr->keep_samples[uVar8 >> 3 & 0x1fffffff] >> ((uint)uVar8 & 7) & 1) != 0) {
            pcVar9 = strdup(hdr->samples[uVar8]);
            lVar13 = (long)iVar4;
            iVar4 = iVar4 + 1;
            ppcVar7[lVar13] = pcVar9;
          }
        }
        free(hdr->samples);
        hdr->samples = ppcVar7;
        pkVar10 = (kh_vdict_t *)hdr->dict[2];
        bVar14 = 0;
        for (uVar8 = 0; uVar8 != pkVar10->n_buckets; uVar8 = uVar8 + 1) {
          if ((pkVar10->flags[uVar8 >> 4 & 0xfffffff] >> (bVar14 & 0x1e) & 3) == 0) {
            free(pkVar10->keys[uVar8]);
          }
          bVar14 = bVar14 + 2;
        }
        kh_destroy_vdict(pkVar10);
        pkVar10 = kh_init_vdict();
        hdr->dict[2] = pkVar10;
        for (lVar13 = 0; lVar13 < hdr->n[2]; lVar13 = lVar13 + 1) {
          kVar5 = kh_put_vdict(pkVar10,hdr->samples[lVar13],&ignore);
          pbVar2 = pkVar10->vals;
          pbVar1 = pbVar2 + (int)kVar5;
          pbVar1->info[0] = 0xf;
          pbVar1->info[1] = 0xf;
          *(undefined8 *)(pbVar1->info + 2) = 0xf;
          pbVar2[(int)kVar5].hrec[0] = (bcf_hrec_t *)0x0;
          pbVar2[(int)kVar5].hrec[1] = (bcf_hrec_t *)0x0;
          pbVar2[(int)kVar5].hrec[2] = (bcf_hrec_t *)0x0;
          (pbVar2[(int)kVar5].hrec + 2)[1] = (bcf_hrec_t *)0xffffffff;
          pkVar10->vals[(int)kVar5].id = pkVar10->size - 1;
        }
        bcf_hdr_sync(hdr);
        return local_3c;
      }
      free(hdr->keep_samples);
      hdr->keep_samples = (uint8_t *)0x0;
      return local_3c;
    }
  }
  return 0;
}

Assistant:

int bcf_hdr_set_samples(bcf_hdr_t *hdr, const char *samples, int is_file)
{
    if ( samples && !strcmp("-",samples) ) return 0;            // keep all samples

    hdr->nsamples_ori = bcf_hdr_nsamples(hdr);
    if ( !samples ) { bcf_hdr_nsamples(hdr) = 0; return 0; }    // exclude all samples

    int i, narr = bit_array_size(bcf_hdr_nsamples(hdr));
    hdr->keep_samples = (uint8_t*) calloc(narr,1);
    if ( samples[0]=='^' )
        for (i=0; i<bcf_hdr_nsamples(hdr); i++) bit_array_set(hdr->keep_samples,i);

    int idx, n, ret = 0;
    char **smpls = hts_readlist(samples[0]=='^'?samples+1:samples, is_file, &n);
    if ( !smpls ) return -1;
    for (i=0; i<n; i++)
    {
        idx = bcf_hdr_id2int(hdr,BCF_DT_SAMPLE,smpls[i]);
        if ( idx<0 )
        {
            if ( !ret ) ret = i+1;
            continue;
        }
        assert( idx<bcf_hdr_nsamples(hdr) );
        if (  samples[0]=='^' )
            bit_array_clear(hdr->keep_samples, idx);
        else
            bit_array_set(hdr->keep_samples, idx);
    }
    for (i=0; i<n; i++) free(smpls[i]);
    free(smpls);

    bcf_hdr_nsamples(hdr) = 0;
    for (i=0; i<hdr->nsamples_ori; i++)
        if ( bit_array_test(hdr->keep_samples,i) ) bcf_hdr_nsamples(hdr)++;
    if ( !bcf_hdr_nsamples(hdr) ) { free(hdr->keep_samples); hdr->keep_samples=NULL; }
    else
    {
        char **samples = (char**) malloc(sizeof(char*)*bcf_hdr_nsamples(hdr));
        idx = 0;
        for (i=0; i<hdr->nsamples_ori; i++)
            if ( bit_array_test(hdr->keep_samples,i) ) samples[idx++] = strdup(hdr->samples[i]);
        free(hdr->samples);
        hdr->samples = samples;

        // delete original samples from the dictionary
        vdict_t *d = (vdict_t*)hdr->dict[BCF_DT_SAMPLE];
        int k;
        for (k = kh_begin(d); k != kh_end(d); ++k)
            if (kh_exist(d, k)) free((char*)kh_key(d, k));
        kh_destroy(vdict, d);

        // add the subset back
        hdr->dict[BCF_DT_SAMPLE] = d = kh_init(vdict);
        for (i=0; i<bcf_hdr_nsamples(hdr); i++)
        {
            int ignore, k = kh_put(vdict, d, hdr->samples[i], &ignore);
            kh_val(d, k) = bcf_idinfo_def;
            kh_val(d, k).id = kh_size(d) - 1;
        }
        bcf_hdr_sync(hdr);
    }

    return ret;
}